

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AppendIncludeDirectories
          (cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes_vec,cmSourceFile *sourceFile)

{
  pointer pbVar1;
  bool bVar2;
  ostream *poVar3;
  cmSourceFileLocation *pcVar4;
  pointer in_name;
  __ireturn_type _Var5;
  string local_200;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueIncludes;
  string inc;
  
  uniqueIncludes._M_h._M_buckets = &uniqueIncludes._M_h._M_single_bucket;
  uniqueIncludes._M_h._M_bucket_count = 1;
  uniqueIncludes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  uniqueIncludes._M_h._M_element_count = 0;
  uniqueIncludes._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  uniqueIncludes._M_h._M_rehash_policy._M_next_resize = 0;
  uniqueIncludes._M_h._M_single_bucket = (__node_base_ptr)0x0;
  in_name = (includes_vec->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (includes_vec->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (in_name == pbVar1) {
LAB_001d9146:
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&uniqueIncludes._M_h);
      return;
    }
    bVar2 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&inc);
      poVar3 = std::operator<<((ostream *)&inc,
                               "Found relative path while evaluating include directories of \"");
      pcVar4 = cmSourceFile::GetLocation(sourceFile);
      poVar3 = std::operator<<(poVar3,(string *)&pcVar4->Name);
      poVar3 = std::operator<<(poVar3,"\":\n  \"");
      poVar3 = std::operator<<(poVar3,(string *)in_name);
      std::operator<<(poVar3,"\"\n");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&inc);
      goto LAB_001d9146;
    }
    std::__cxx11::string::string((string *)&inc,(string *)in_name);
    bVar2 = cmSystemTools::IsOff(&inc);
    if (!bVar2) {
      cmsys::SystemTools::ConvertToUnixSlashes(&inc);
    }
    _Var5 = std::__detail::
            _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      *)&uniqueIncludes,&inc);
    if (((undefined1  [16])_Var5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)includes,&inc)
      ;
    }
    std::__cxx11::string::~string((string *)&inc);
    in_name = in_name + 1;
  } while( true );
}

Assistant:

void cmLocalGenerator::AppendIncludeDirectories(
  std::vector<std::string>& includes,
  const std::vector<std::string>& includes_vec,
  const cmSourceFile& sourceFile) const
{
  std::unordered_set<std::string> uniqueIncludes;

  for (const std::string& include : includes_vec) {
    if (!cmSystemTools::FileIsFullPath(include)) {
      std::ostringstream e;
      e << "Found relative path while evaluating include directories of "
           "\""
        << sourceFile.GetLocation().GetName() << "\":\n  \"" << include
        << "\"\n";

      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }

    std::string inc = include;

    if (!cmSystemTools::IsOff(inc)) {
      cmSystemTools::ConvertToUnixSlashes(inc);
    }

    if (uniqueIncludes.insert(inc).second) {
      includes.push_back(std::move(inc));
    }
  }
}